

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O2

QString * __thiscall
QCborValueConstRef::concreteString
          (QString *__return_storage_ptr__,QCborValueConstRef *this,QCborValueConstRef self,
          QString *defaultValue)

{
  if ((int)(&(this[3].d)->usedData)[(long)self.d * 2] == 0x60) {
    QCborContainerPrivate::stringAt
              (__return_storage_ptr__,(QCborContainerPrivate *)this,(qsizetype)self.d);
  }
  else {
    QArrayDataPointer<char16_t>::QArrayDataPointer
              (&__return_storage_ptr__->d,(QArrayDataPointer<char16_t> *)self.i);
  }
  return __return_storage_ptr__;
}

Assistant:

QString QCborValueConstRef::concreteString(QCborValueConstRef self, const QString &defaultValue)
{
    QtCbor::Element e = self.d->elements.at(self.i);
    if (e.type != QCborValue::String)
        return defaultValue;
    return self.d->stringAt(self.i);
}